

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggreports.cpp
# Opt level: O0

void __thiscall
aggreports::WriteORDOutput
          (aggreports *this,vector<int,_std::allocator<int>_> *fileIDs,int summary_id,int epcalc,
          int eptype,double retperiod,OASIS_FLOAT loss)

{
  int strLen_00;
  char local_1038 [4];
  int strLen;
  char buffer [4096];
  int bufferSize;
  OASIS_FLOAT loss_local;
  double retperiod_local;
  int eptype_local;
  int epcalc_local;
  int summary_id_local;
  vector<int,_std::allocator<int>_> *fileIDs_local;
  aggreports *this_local;
  
  buffer[0xff8] = '\0';
  buffer[0xff9] = '\x10';
  buffer[0xffa] = '\0';
  buffer[0xffb] = '\0';
  buffer._4092_4_ = loss;
  strLen_00 = snprintf(local_1038,0x1000,"%d,%d,%d,%f,%f\n",retperiod,(double)loss,
                       (ulong)(uint)summary_id,(ulong)(uint)epcalc,(ulong)(uint)eptype);
  OutputRows(this,fileIDs,local_1038,strLen_00);
  return;
}

Assistant:

void aggreports::WriteORDOutput(const std::vector<int> &fileIDs,
				const int summary_id, const int epcalc,
				const int eptype, const double retperiod,
				const OASIS_FLOAT loss) {

  const int bufferSize = 4096;
  char buffer[bufferSize];
  int strLen;
  strLen = snprintf(buffer, bufferSize, "%d,%d,%d,%f,%f\n", summary_id, epcalc,
		    eptype, retperiod, loss);
  OutputRows(fileIDs, buffer, strLen);

}